

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.c
# Opt level: O1

void read_grammar(void)

{
  int iVar1;
  ushort **ppuVar2;
  
  initialize_grammar();
  advance_to_start();
  iVar1 = nextc();
  if (iVar1 != -1) {
    ppuVar2 = __ctype_b_loc();
    do {
      if (((*ppuVar2)[iVar1] >> 10 & 1) != 0) goto switchD_00116c27_caseD_22;
      if (iVar1 < 0x3d) {
        switch(iVar1) {
        case 0x23:
        case 0x26:
switchD_00116c27_caseD_23:
          syntax_error(input_file->lineno,line,cptr);
          break;
        case 0x25:
          iVar1 = mark_symbol();
          if (iVar1 == 0) break;
          goto LAB_00116cc2;
        default:
          if (iVar1 != 0x2e) goto switchD_00116c27_caseD_23;
        case 0x22:
        case 0x24:
        case 0x27:
switchD_00116c27_caseD_22:
          add_symbol();
        }
      }
      else if (iVar1 < 0x5f) {
        if ((iVar1 != 0x3d) && (iVar1 != 0x5b)) goto switchD_00116c27_caseD_23;
LAB_00116c5d:
        copy_action();
      }
      else {
        if (iVar1 != 0x7c) {
          if (iVar1 == 0x7b) goto LAB_00116c5d;
          if (iVar1 == 0x5f) goto switchD_00116c27_caseD_22;
          goto switchD_00116c27_caseD_23;
        }
        end_rule();
        start_rule(plhs[(long)nrules + -1],0);
        cptr = cptr + 1;
      }
      iVar1 = nextc();
    } while (iVar1 != -1);
  }
LAB_00116cc2:
  end_rule();
  if (goal->args < 1) {
    return;
  }
  error(0,(char *)0x0,(char *)0x0,"start symbol %s requires arguments",goal->name);
  return;
}

Assistant:

void read_grammar()
{
    register int c;

    initialize_grammar();
    advance_to_start();

    for (;;) {
	c = nextc();
	if (c == EOF) break;
	if (isalpha(c) || c == '_' || c == '.' || c == '$' || c == '\'' ||
		c == '"')
	    add_symbol();
	else if (c == '{' || c == '=' || c == '[')
	    copy_action();
	else if (c == '|') {
	    end_rule();
	    start_rule(plhs[nrules-1], 0);
	    ++cptr; }
	else if (c == '%') {
	    if (mark_symbol()) break; }
	else
	    syntax_error(input_file->lineno, line, cptr); }
    end_rule();
    if (goal->args > 0)
	error(0, 0, 0, "start symbol %s requires arguments", goal->name);
}